

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ambient_light.cpp
# Opt level: O1

Light_SampleRes * __thiscall
embree::AmbientLight_sample
          (Light_SampleRes *__return_storage_ptr__,embree *this,Light *super,
          DifferentialGeometry *dg,Vec2f *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar8;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [12];
  float fVar12;
  float fVar13;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar14 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  vfloat4 a;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  
  uVar8 = 0;
  fVar9 = (float)dg->instIDs[0];
  fVar4 = (float)dg->geomID;
  if (fVar4 < 0.0) {
    fVar3 = sqrtf(fVar4);
    in_XMM0_Db = extraout_XMM0_Db;
    uVar8 = extraout_XMM0_Dc;
    in_XMM0_Dd = extraout_XMM0_Dd;
  }
  else {
    fVar3 = SQRT(fVar4);
  }
  fVar9 = fVar9 * 6.2831855;
  fVar4 = 1.0 - fVar4;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar5 = sinf(fVar9);
  fVar6 = cosf(fVar9);
  fVar6 = fVar6 * fVar4;
  fVar5 = fVar5 * fVar4;
  fVar9 = (float)super[0x10].type;
  fVar4 = (float)super[0x12].type;
  fVar10 = -(float)super[0x11].type;
  fVar22 = -fVar4;
  auVar11._8_4_ = 0xffffffff;
  auVar11._0_8_ = 0xffffffffffffffff;
  if (fVar10 * fVar10 + fVar4 * fVar4 + 0.0 <= fVar9 * fVar9 + fVar22 * fVar22 + 0.0) {
    auVar11 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar4 = (float)((uint)fVar4 & auVar11._4_4_);
  fVar22 = (float)(~auVar11._0_4_ & (uint)fVar22);
  fVar17 = (float)(~auVar11._8_4_ & (uint)fVar9 | (uint)fVar10 & auVar11._8_4_);
  fVar9 = fVar4 * fVar4;
  fVar10 = fVar17 * fVar17;
  fVar23 = fVar9 + fVar22 * fVar22 + fVar10;
  fVar24 = fVar9 + fVar9 + 0.0;
  fVar10 = fVar9 + fVar10 + fVar10;
  fVar9 = fVar9 + 0.0 + 0.0;
  auVar25._4_4_ = fVar24;
  auVar25._0_4_ = fVar23;
  auVar25._8_4_ = fVar10;
  auVar25._12_4_ = fVar9;
  auVar1._4_4_ = fVar24;
  auVar1._0_4_ = fVar23;
  auVar1._8_4_ = fVar10;
  auVar1._12_4_ = fVar9;
  auVar26 = rsqrtss(auVar25,auVar1);
  fVar9 = auVar26._0_4_;
  fVar12 = fVar9 * 1.5 - fVar9 * fVar9 * fVar23 * 0.5 * fVar9;
  fVar22 = fVar12 * fVar22;
  fVar4 = fVar12 * fVar4;
  fVar17 = fVar12 * fVar17;
  fVar12 = fVar12 * 0.0;
  fVar9 = (float)super[0x10].type;
  fVar10 = (float)super[0x11].type;
  fVar23 = (float)super[0x12].type;
  fVar24 = (float)super[0x13].type;
  fVar13 = fVar4 * fVar9 - fVar10 * fVar22;
  fVar15 = fVar17 * fVar10 - fVar23 * fVar4;
  fVar18 = fVar22 * fVar23 - fVar9 * fVar17;
  fVar20 = fVar12 * fVar24 - fVar24 * fVar12;
  fVar16 = fVar15 * fVar15;
  fVar19 = fVar18 * fVar18;
  fVar21 = fVar20 * fVar20;
  fVar27 = fVar19 + fVar16 + fVar13 * fVar13;
  fVar28 = fVar21 + fVar16 + fVar16;
  fVar19 = fVar19 + fVar16 + fVar19;
  fVar21 = fVar21 + fVar16 + fVar21;
  auVar14._4_4_ = fVar28;
  auVar14._0_4_ = fVar27;
  auVar14._8_4_ = fVar19;
  auVar14._12_4_ = fVar21;
  auVar2._4_4_ = fVar28;
  auVar2._0_4_ = fVar27;
  auVar2._8_4_ = fVar19;
  auVar2._12_4_ = fVar21;
  auVar26 = rsqrtss(auVar14,auVar2);
  fVar16 = auVar26._0_4_;
  fVar16 = fVar16 * 1.5 - fVar16 * fVar16 * fVar27 * 0.5 * fVar16;
  (__return_storage_ptr__->dir).field_0.m128[0] =
       fVar6 * fVar22 + fVar3 * fVar9 + fVar5 * fVar16 * fVar15;
  (__return_storage_ptr__->dir).field_0.m128[1] =
       fVar6 * fVar4 + fVar3 * fVar10 + fVar5 * fVar16 * fVar18;
  (__return_storage_ptr__->dir).field_0.m128[2] =
       fVar6 * fVar17 + fVar3 * fVar23 + fVar5 * fVar16 * fVar13;
  (__return_storage_ptr__->dir).field_0.m128[3] =
       fVar6 * fVar12 + fVar3 * fVar24 + fVar5 * fVar16 * fVar20;
  fVar3 = fVar3 / 3.1415927;
  __return_storage_ptr__->pdf = fVar3;
  __return_storage_ptr__->dist = INFINITY;
  auVar7._4_4_ = in_XMM0_Db;
  auVar7._0_4_ = fVar3;
  auVar7._8_4_ = uVar8;
  auVar7._12_4_ = in_XMM0_Dd;
  auVar26._4_4_ = in_XMM0_Db;
  auVar26._0_4_ = fVar3;
  auVar26._8_4_ = uVar8;
  auVar26._12_4_ = in_XMM0_Dd;
  auVar26 = rcpss(auVar7,auVar26);
  fVar5 = (2.0 - fVar3 * auVar26._0_4_) * auVar26._0_4_;
  fVar9 = *(float *)(this + 0x14);
  fVar4 = *(float *)(this + 0x18);
  fVar3 = *(float *)(this + 0x1c);
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar5 * *(float *)(this + 0x10);
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar5 * fVar9;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar5 * fVar4;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar5 * fVar3;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes AmbientLight_sample(const Light* super,
                                                                 const DifferentialGeometry& dg,
                                                                 const Vec2f& s)
{
  AmbientLight* self = (AmbientLight*)super;
  Light_SampleRes res;

  const Vec3fa localDir = cosineSampleHemisphere(s);
  res.dir = frame(dg.Ns) * localDir;
  res.pdf = cosineSampleHemispherePDF(localDir);
  res.dist = inf;
  res.weight = self->radiance * rcp(res.pdf);

  return res;
}